

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_transform.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListTransformBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  reference pvVar3;
  pointer pEVar4;
  BoundLambdaExpression *pBVar5;
  BinderException *this_00;
  allocator local_59;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_58;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  if ((pEVar4->super_BaseExpression).expression_class == BOUND_LAMBDA) {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    local_58._M_head_impl =
         (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddArrayCastToList
              ((BoundCastExpression *)&stack0xffffffffffffffb0,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_58);
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    _Var2._M_head_impl = local_50._M_head_impl;
    local_50._M_head_impl = (Expression *)0x0;
    _Var1._M_head_impl =
         (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_50._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(_func_int **)local_50._M_head_impl + 8))();
    }
    local_50._M_head_impl = (Expression *)0x0;
    if (local_58._M_head_impl != (Expression *)0x0) {
      (*((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_58._M_head_impl = (Expression *)0x0;
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,1);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    pBVar5 = BaseExpression::Cast<duckdb::BoundLambdaExpression>(&pEVar4->super_BaseExpression);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pBVar5->lambda_expr);
    LogicalType::LIST((LogicalType *)&stack0xffffffffffffffb0,&pEVar4->return_type);
    LogicalType::operator=
              (&(bound_function->super_BaseScalarFunction).return_type,
               (LogicalType *)&stack0xffffffffffffffb0);
    LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffb0);
    LambdaFunctions::ListLambdaBind
              ((LambdaFunctions *)this,context,bound_function,arguments,pBVar5->parameter_count == 2
              );
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb0,"Invalid lambda expression!",&local_59);
  BinderException::BinderException(this_00,(string *)&stack0xffffffffffffffb0);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> ListTransformBind(ClientContext &context, ScalarFunction &bound_function,
                                                  vector<unique_ptr<Expression>> &arguments) {

	// the list column and the bound lambda expression
	D_ASSERT(arguments.size() == 2);
	if (arguments[1]->GetExpressionClass() != ExpressionClass::BOUND_LAMBDA) {
		throw BinderException("Invalid lambda expression!");
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	auto &bound_lambda_expr = arguments[1]->Cast<BoundLambdaExpression>();
	bound_function.return_type = LogicalType::LIST(bound_lambda_expr.lambda_expr->return_type);
	auto has_index = bound_lambda_expr.parameter_count == 2;
	return LambdaFunctions::ListLambdaBind(context, bound_function, arguments, has_index);
}